

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::Formattable::getString(Formattable *this,UErrorCode *status)

{
  UErrorCode *status_local;
  Formattable *this_local;
  
  if (this->fType == kString) {
    if ((this->fValue).fObject == (UObject *)0x0) {
      setError(status,U_MEMORY_ALLOCATION_ERROR);
      this_local = (Formattable *)getBogus(this);
    }
    else {
      this_local = (this->fValue).fArrayAndCount.fArray;
    }
  }
  else {
    setError(status,U_INVALID_FORMAT_ERROR);
    this_local = (Formattable *)getBogus(this);
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString& 
Formattable::getString(UErrorCode& status) 
{
    if (fType != kString) {
        setError(status, U_INVALID_FORMAT_ERROR);
        return *getBogus();
    }
    if (fValue.fString == NULL) {
    	setError(status, U_MEMORY_ALLOCATION_ERROR);
    	return *getBogus();
    }
    return *fValue.fString;
}